

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O3

Vector3d * __thiscall
OpenMD::HydroProp::getCenterOfDiffusion
          (Vector3d *__return_storage_ptr__,HydroProp *this,RealType temperature)

{
  double dVar1;
  undefined8 uVar2;
  uint i;
  uint j;
  long lVar3;
  long lVar4;
  double (*__return_storage_ptr___00) [3];
  Vector<double,_3U> result;
  Mat3x3d Dorr;
  Mat3x3d Dotr;
  Mat6x6d Do;
  double local_2b8 [4];
  double local_298 [10];
  double local_248 [10];
  undefined1 local_1f8 [16];
  double local_1e8;
  Vector3d local_1d8;
  Mat6x6d local_1c0;
  double local_a0 [9];
  SquareMatrix3<double> local_58;
  
  lVar4 = 0;
  local_1d8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_1d8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_1d8.super_Vector<double,_3U>.data_[1] = 0.0;
  getDiffusionTensorAtPos(&local_1c0,this,&local_1d8,temperature);
  local_248[8] = 0.0;
  local_248[6] = 0.0;
  local_248[7] = 0.0;
  local_248[4] = 0.0;
  local_248[5] = 0.0;
  local_248[2] = 0.0;
  local_248[3] = 0.0;
  local_248[0] = 0.0;
  local_248[1] = 0.0;
  local_298[8] = 0.0;
  local_298[6] = 0.0;
  local_298[7] = 0.0;
  local_298[4] = 0.0;
  local_298[5] = 0.0;
  local_298[2] = 0.0;
  local_298[3] = 0.0;
  local_298[0] = 0.0;
  local_298[1] = 0.0;
  do {
    *(undefined8 *)((long)local_248 + lVar4 + 0x10) =
         *(undefined8 *)((long)local_a0 + lVar4 * 2 + -0x80);
    uVar2 = *(undefined8 *)((long)local_a0 + lVar4 * 2 + -0x88);
    *(undefined8 *)((long)local_248 + lVar4) = *(undefined8 *)((long)local_a0 + lVar4 * 2 + -0x90);
    *(undefined8 *)((long)local_248 + lVar4 + 8) = uVar2;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x48);
  lVar4 = 0;
  do {
    *(undefined8 *)((long)local_298 + lVar4 + 0x10) =
         *(undefined8 *)((long)local_a0 + lVar4 * 2 + -0x68);
    uVar2 = *(undefined8 *)((long)local_a0 + lVar4 * 2 + -0x70);
    *(undefined8 *)((long)local_298 + lVar4) = *(undefined8 *)((long)local_a0 + lVar4 * 2 + -0x78);
    *(undefined8 *)((long)local_298 + lVar4 + 8) = uVar2;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x48);
  local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
       local_298[4] + local_298[8];
  local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] =
       -local_298[1];
  local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] =
       -local_298[2];
  local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] =
       local_298[8] + local_298[0];
  local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] =
       -local_298[5];
  local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
       local_298[4] + local_298[0];
  local_1f8._8_4_ = SUB84(local_248[6] - local_248[2],0);
  local_1f8._0_8_ = local_248[5] - local_248[7];
  local_1f8._12_4_ = (int)((ulong)(local_248[6] - local_248[2]) >> 0x20);
  local_1e8 = local_248[1] - local_248[3];
  __return_storage_ptr___00 = (double (*) [3])local_a0;
  local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] =
       local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1];
  local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] =
       local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2];
  local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] =
       local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2];
  SquareMatrix3<double>::inverse((SquareMatrix3<double> *)__return_storage_ptr___00,&local_58);
  local_2b8[0] = 0.0;
  local_2b8[1] = 0.0;
  local_2b8[2] = 0.0;
  lVar4 = 0;
  do {
    dVar1 = local_2b8[lVar4];
    lVar3 = 0;
    do {
      dVar1 = dVar1 + (((SquareMatrix<double,_3> *)*__return_storage_ptr___00)->
                      super_RectMatrix<double,_3U,_3U>).data_[0][lVar3] *
                      *(double *)(local_1f8 + lVar3 * 8);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    local_2b8[lVar4] = dVar1;
    lVar4 = lVar4 + 1;
    __return_storage_ptr___00 = __return_storage_ptr___00 + 1;
  } while (lVar4 != 3);
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[2] = local_2b8[2];
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] = local_2b8[0];
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] = local_2b8[1];
  return __return_storage_ptr__;
}

Assistant:

Vector3d HydroProp::getCenterOfDiffusion(RealType temperature) {
    // First get the Diffusion tensor at the origin of the coordinate system:

    Vector3d origin(0.0);
    Mat6x6d Do = getDiffusionTensorAtPos(origin, temperature);

    Mat3x3d Dotr;
    Mat3x3d Dorr;

    Do.getSubMatrix(3, 0, Dotr);
    Do.getSubMatrix(3, 3, Dorr);

    Mat3x3d tmp;
    Vector3d tmpVec;

    // Find center of diffusion
    tmp(0, 0) = Dorr(1, 1) + Dorr(2, 2);
    tmp(0, 1) = -Dorr(0, 1);
    tmp(0, 2) = -Dorr(0, 2);
    tmp(1, 0) = -Dorr(0, 1);
    tmp(1, 1) = Dorr(0, 0) + Dorr(2, 2);
    tmp(1, 2) = -Dorr(1, 2);
    tmp(2, 0) = -Dorr(0, 2);
    tmp(2, 1) = -Dorr(1, 2);
    tmp(2, 2) = Dorr(1, 1) + Dorr(0, 0);

    // Vector3d tmpVec;
    tmpVec[0] = Dotr(1, 2) - Dotr(2, 1);
    tmpVec[1] = Dotr(2, 0) - Dotr(0, 2);
    tmpVec[2] = Dotr(0, 1) - Dotr(1, 0);

    // center of difussion
    Vector3d cod = tmp.inverse() * tmpVec;
    return cod;
  }